

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationZ.hpp
# Opt level: O0

RotationZ<std::complex<float>_> * __thiscall
qclab::qgates::RotationZ<std::complex<float>_>::operator/=
          (RotationZ<std::complex<float>_> *this,RotationZ<std::complex<float>_> *rhs)

{
  int iVar1;
  int iVar2;
  rotation_type *rhs_00;
  RotationZ<std::complex<float>_> *rhs_local;
  RotationZ<std::complex<float>_> *this_local;
  
  iVar1 = (*(this->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.
            super_QObject<std::complex<float>_>._vptr_QObject[3])();
  iVar2 = (*(rhs->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.
            super_QObject<std::complex<float>_>._vptr_QObject[3])();
  if (iVar1 == iVar2) {
    rhs_00 = QRotationGate1<std::complex<float>_>::rotation
                       (&rhs->super_QRotationGate1<std::complex<float>_>);
    QRotation<float>::operator/=
              (&(this->super_QRotationGate1<std::complex<float>_>).rotation_,rhs_00);
    return this;
  }
  __assert_fail("this->qubit() == rhs.qubit()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/RotationZ.hpp"
                ,0xaa,
                "RotationZ<T> &qclab::qgates::RotationZ<std::complex<float>>::operator/=(const RotationZ<T> &) [T = std::complex<float>]"
               );
}

Assistant:

inline RotationZ< T >& operator/=( const RotationZ< T >& rhs ) {
          assert( this->qubit() == rhs.qubit() ) ;
          this->rotation_ /= rhs.rotation() ;
          return *this ;
        }